

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O3

void __thiscall xLearn::Checker::check_conflict_predict(Checker *this,HyperParam *hyper_param)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier mag;
  Modifier local_44;
  Modifier local_40;
  Modifier local_3c;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if ((hyper_param->sign == true) && (hyper_param->sigmoid == true)) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Both of --sign and --sigmoid have been set. xLearn has already disable --sign and --sigmoid."
               ,"");
    local_40.code = BOLD;
    local_44.code = RESET;
    local_3c.code = FG_MAGENTA;
    poVar1 = Color::operator<<((ostream *)&std::cout,&local_3c);
    poVar1 = Color::operator<<(poVar1,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[ WARNING    ] ",0xf);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
    poVar1 = Color::operator<<(poVar1,&local_44);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    hyper_param->sign = false;
    hyper_param->sigmoid = false;
  }
  return;
}

Assistant:

void Checker::check_conflict_predict(HyperParam& hyper_param) {
  if (hyper_param.sign && hyper_param.sigmoid) {
    Color::print_warning("Both of --sign and --sigmoid have been set. "
                         "xLearn has already disable --sign and --sigmoid.");
    hyper_param.sign = false;
    hyper_param.sigmoid = false;
  }
}